

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# routing_table.cpp
# Opt level: O1

tuple<int,_int,_int> __thiscall libtorrent::dht::routing_table::size(routing_table *this)

{
  int iVar1;
  _Head_base<0UL,_int,_false> _Var2;
  long in_RSI;
  long *plVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  tuple<int,_int,_int> tVar8;
  
  plVar3 = *(long **)(in_RSI + 0x10);
  if (plVar3 == *(long **)(in_RSI + 0x18)) {
    _Var2._M_head_impl = 0;
    iVar4 = 0;
    iVar1 = 0;
  }
  else {
    iVar1 = 0;
    iVar4 = 0;
    _Var2._M_head_impl = 0;
    do {
      lVar7 = plVar3[3];
      iVar6 = 0;
      uVar5 = plVar3[4] - lVar7;
      if (uVar5 != 0) {
        iVar6 = 0;
        do {
          iVar6 = iVar6 + (uint)(*(char *)(lVar7 + 0x3a) == '\0');
          lVar7 = lVar7 + 0x40;
        } while (lVar7 != plVar3[4]);
      }
      iVar4 = iVar4 + iVar6;
      iVar1 = iVar1 + (int)(uVar5 >> 6);
      _Var2._M_head_impl = _Var2._M_head_impl + (int)((ulong)(plVar3[1] - *plVar3) >> 6);
      plVar3 = plVar3 + 6;
    } while (plVar3 != *(long **)(in_RSI + 0x18));
  }
  *(int *)&this->m_log = iVar4;
  *(int *)((long)&this->m_log + 4) = _Var2._M_head_impl;
  *(int *)&this->m_settings = iVar1;
  tVar8.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl =
       _Var2._M_head_impl;
  tVar8.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int> =
       (_Tuple_impl<1UL,_int,_int>)this;
  return (tuple<int,_int,_int>)tVar8.super__Tuple_impl<0UL,_int,_int,_int>;
}

Assistant:

std::tuple<int, int, int> routing_table::size() const
{
	int nodes = 0;
	int replacements = 0;
	int confirmed = 0;
	for (auto const& i : m_buckets)
	{
		nodes += int(i.live_nodes.size());
		confirmed += static_cast<int>(std::count_if(i.live_nodes.begin(), i.live_nodes.end()
			, [](node_entry const& k) { return k.confirmed(); } ));

		replacements += int(i.replacements.size());
	}
	return std::make_tuple(nodes, replacements, confirmed);
}